

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,bool *interrupt)

{
  undefined1 *puVar1;
  double dVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Settings *pSVar4;
  Statistics *pSVar5;
  bool bVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_48;
  
  puVar1 = &(this->_solReal).field_0xc8;
  *puVar1 = *puVar1 & 0xf0;
  this->_optimizeCalls = this->_optimizeCalls + 1;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  if (this->_currentSettings->_boolParamValues[9] == true) {
    if (this->_scaler ==
        (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
LAB_002abbed:
      if (this->_realLP->_isScaled == true) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::unscaleLPandReloadBasis(&this->_solver);
        this->_isRealLPScaled = false;
        this->_unscaleCalls = this->_unscaleCalls + 1;
      }
    }
    else if (this->_realLP->_isScaled == false) {
      bVar6 = _reapplyPersistentScaling(this);
      pSVar3 = this->_scaler;
      if (bVar6) {
        (*pSVar3->_vptr_SPxScaler[0xd])(pSVar3,this->_realLP,1);
        this->_isRealLPScaled = this->_realLP->_isScaled;
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::invalidateBasis(&this->_solver);
      }
      else if (pSVar3 == (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x0) goto LAB_002abbed;
    }
  }
  this->_lastSolveMode = 0;
  if (this->_hasBasis == false) {
    pSVar4 = this->_currentSettings;
    dVar2 = pSVar4->_realParamValues[6];
    if ((pSVar4->_realParamValues[8] == -dVar2) &&
       (!NAN(pSVar4->_realParamValues[8]) && !NAN(-dVar2))) {
      bVar6 = true;
      if ((pSVar4->_realParamValues[9] == dVar2) &&
         (!NAN(pSVar4->_realParamValues[9]) && !NAN(dVar2))) goto LAB_002abc62;
    }
  }
  bVar6 = false;
LAB_002abc62:
  _preprocessAndSolveReal(this,bVar6,interrupt);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getMatrixMetric(&local_48,
                    &(this->_solver).
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,0);
  pSVar5 = this->_statistics;
  *(undefined8 *)((pSVar5->finalBasisCondition).m_backend.data._M_elems + 8) =
       local_48.m_backend.data._M_elems._32_8_;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[4] = local_48.m_backend.data._M_elems[4];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[5] = local_48.m_backend.data._M_elems[5];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[6] = local_48.m_backend.data._M_elems[6];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[7] = local_48.m_backend.data._M_elems[7];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0] = local_48.m_backend.data._M_elems[0];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[1] = local_48.m_backend.data._M_elems[1];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[2] = local_48.m_backend.data._M_elems[2];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[3] = local_48.m_backend.data._M_elems[3];
  (pSVar5->finalBasisCondition).m_backend.exp = local_48.m_backend.exp;
  (pSVar5->finalBasisCondition).m_backend.neg = local_48.m_backend.neg;
  (pSVar5->finalBasisCondition).m_backend.fpclass = local_48.m_backend.fpclass;
  (pSVar5->finalBasisCondition).m_backend.prec_elem = local_48.m_backend.prec_elem;
  (*this->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimize(volatile bool* interrupt)
{
   assert(_realLP != nullptr);
   assert(_realLP == &_solver);

   _solReal.invalidate();
   ++_optimizeCalls;

   // start timing
   _statistics->solvingTime->start();

   if(boolParam(SoPlexBase<R>::PERSISTENTSCALING))
   {
      // scale original problem; overwriting _realLP
      if(_scaler && !_realLP->isScaled() && _reapplyPersistentScaling())
      {
#ifdef SOPLEX_DEBUG
         SPxLPBase<R>* origLP = 0;
         spx_alloc(origLP);
         origLP = new(origLP) SPxLPBase<R>(*_realLP);
#endif
         _scaler->scale(*_realLP, true);
         _isRealLPScaled = _realLP->isScaled(); // a scaler might decide not to apply scaling
         _solver.invalidateBasis();
#ifdef SOPLEX_DEBUG
         _checkScaling(origLP);
#endif
      }
      // unscale previously scaled problem, overwriting _realLP
      else if(!_scaler && _realLP->isScaled())
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }
   }

   // remember that last solve was in floating-point
   _lastSolveMode = SOLVEMODE_REAL;

   // solve and store solution; if we have a starting basis, do not apply preprocessing; if we are solving from
   // scratch, apply preprocessing according to parameter settings
   if(!_hasBasis && realParam(SoPlexBase<R>::OBJLIMIT_LOWER) == -realParam(SoPlexBase<R>::INFTY)
         && realParam(SoPlexBase<R>::OBJLIMIT_UPPER) == realParam(SoPlexBase<R>::INFTY))
      _preprocessAndSolveReal(true, interrupt);
   else
      _preprocessAndSolveReal(false, interrupt);

   _statistics->finalBasisCondition = _solver.getBasisMetric(0);

   // stop timing
   _statistics->solvingTime->stop();
}